

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void solver_finished_cb(result *r)

{
  uint uVar1;
  pointer psVar2;
  undefined1 auVar3 [16];
  unsigned_long_long uVar4;
  size_t sVar5;
  char *pcVar6;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  double local_38 [2];
  double local_28;
  
  local_38[0] = 0.0;
  format_str.size_ = 0x10;
  format_str.data_ = "Solver finished\n";
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_38;
  fmt::v7::vprint(_stdout,format_str,(format_args)(auVar3 << 0x40));
  switch(r->status) {
  case success:
    psVar2 = (r->solutions).
             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((r->solutions).super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
        _M_impl.super__Vector_impl_data._M_start == psVar2) {
      return;
    }
    if (psVar2[-1].variables.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        psVar2[-1].variables.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (-1 < r->loop) {
        fmt::v7::print<char[49],double_const&,long_const&,double_const&,char>
                  ((char (*) [49])"Best solution found: {:.10g} in {} loop and {}s\n",
                   &psVar2[-1].value,&r->loop,&r->duration);
        return;
      }
      local_38[0] = (double)-r->loop;
      fmt::v7::print<char[58],double_const&,long,double_const&,char>
                ((char (*) [58])"Best solution found via push: {:.10g} in {} loop and {}s\n",
                 &psVar2[-1].value,(long *)local_38,&r->duration);
      return;
    }
    local_38[0] = psVar2[-1].value;
    local_28 = r->duration;
    pcVar6 = "Best solution found via preprocessor: {:.10g} in {}s\n";
    sVar5 = 0x35;
    uVar4 = 0xaa;
    goto LAB_0011d81f;
  case internal_error:
    pcVar6 = "No solution. Internal error\n";
    sVar5 = 0x1c;
    break;
  case uninitialized:
    pcVar6 = "No solution. Uninitialized error\n";
    sVar5 = 0x21;
    break;
  case time_limit_reached:
    uVar1 = r->remaining_constraints;
    local_28 = r->duration;
    pcVar6 = "No solution. Constraint remaining: {}. Time limit reached at {}s.\n";
    goto LAB_0011d7f8;
  case kappa_max_reached:
    uVar1 = r->remaining_constraints;
    local_28 = r->duration;
    pcVar6 = "No solution. Constraint remaining: {}. Kappa reached in {}s.\n";
    sVar5 = 0x3d;
    goto LAB_0011d7fd;
  case limit_reached:
    uVar1 = r->remaining_constraints;
    local_28 = r->duration;
    pcVar6 = "No solution. Constraint remaining: {}. Loop limit reached in {}s.\n";
LAB_0011d7f8:
    sVar5 = 0x42;
LAB_0011d7fd:
    local_38[0] = (double)(ulong)uVar1;
    uVar4 = 0xa1;
    goto LAB_0011d81f;
  case empty_context:
    pcVar6 = "Context uninitialized\n";
    sVar5 = 0x16;
    break;
  default:
    goto switchD_0011d6ff_default;
  }
  local_38[0] = 0.0;
  uVar4 = 0;
LAB_0011d81f:
  format_str_00.size_ = sVar5;
  format_str_00.data_ = pcVar6;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_38;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = uVar4;
  fmt::v7::vprint(_stdout,format_str_00,args);
switchD_0011d6ff_default:
  return;
}

Assistant:

static void
solver_finished_cb(const baryonyx::result& r)
{
    fmt::print("Solver finished\n");

    switch (r.status) {
    case baryonyx::result_status::success:
        if (!r.solutions.empty()) {
            if (r.solutions.back().variables.empty()) {
                fmt::print(
                  "Best solution found via preprocessor: {:.10g} in {}s\n",
                  r.solutions.back().value,
                  r.duration);
            } else {
                if (r.loop >= 0)
                    fmt::print(
                      "Best solution found: {:.10g} in {} loop and {}s\n",
                      r.solutions.back().value,
                      r.loop,
                      r.duration);
                else
                    fmt::print("Best solution found via push: {:.10g} in {} "
                               "loop and {}s\n",
                               r.solutions.back().value,
                               -r.loop,
                               r.duration);
            }
        }
        break;
    case baryonyx::result_status::internal_error:
        fmt::print("No solution. Internal error\n");
        break;
    case baryonyx::result_status::uninitialized:
        fmt::print("No solution. Uninitialized error\n");
        break;
    case baryonyx::result_status::kappa_max_reached:
        fmt::print(
          "No solution. Constraint remaining: {}. Kappa reached in {}s.\n",
          r.remaining_constraints,
          r.duration);
        break;
    case baryonyx::result_status::time_limit_reached:
        fmt::print("No solution. Constraint remaining: {}. Time limit reached "
                   "at {}s.\n",
                   r.remaining_constraints,
                   r.duration);
        break;
    case baryonyx::result_status::limit_reached:
        fmt::print("No solution. Constraint remaining: {}. Loop limit reached "
                   "in {}s.\n",
                   r.remaining_constraints,
                   r.duration);
        break;
    case baryonyx::result_status::empty_context:
        fmt::print("Context uninitialized\n");
        break;
    }
}